

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.h
# Opt level: O0

bool __thiscall
rapidjson::internal::
Schema<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>_>
::String(Schema<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>_>
         *this,Context *context,Ch *str,SizeType length,bool param_4)

{
  bool bVar1;
  ValueType *pVVar2;
  Ch *pCVar3;
  uint local_34;
  undefined1 local_2d;
  SizeType count;
  bool param_4_local;
  Ch *pCStack_28;
  SizeType length_local;
  Ch *str_local;
  Context *context_local;
  Schema<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>_>
  *this_local;
  
  local_2d = param_4;
  count = length;
  pCStack_28 = str;
  str_local = (Ch *)context;
  context_local = (Context *)this;
  if ((this->type_ & 0x10) == 0) {
    pVVar2 = GetStringString();
    DisallowedType(this,context,pVVar2);
    str_local[0x30] = '\x14';
    str_local[0x31] = '\0';
    str_local[0x32] = '\0';
    str_local[0x33] = '\0';
    pVVar2 = GetValidateErrorKeyword(kValidateErrorType);
    pCVar3 = GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             ::GetString(pVVar2);
    *(Ch **)(str_local + 0x28) = pCVar3;
    return false;
  }
  if (((this->minLength_ != 0) || (this->maxLength_ != 0xffffffff)) &&
     (bVar1 = CountStringCodePoint<rapidjson::UTF8<char>>(str,length,&local_34), bVar1)) {
    if (local_34 < this->minLength_) {
      (**(code **)(**(long **)(str_local + 8) + 0x60))
                (*(long **)(str_local + 8),pCStack_28,count,this->minLength_);
      str_local[0x30] = '\a';
      str_local[0x31] = '\0';
      str_local[0x32] = '\0';
      str_local[0x33] = '\0';
      pVVar2 = GetValidateErrorKeyword(kValidateErrorMinLength);
      pCVar3 = GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               ::GetString(pVVar2);
      *(Ch **)(str_local + 0x28) = pCVar3;
      return false;
    }
    if (this->maxLength_ < local_34) {
      (**(code **)(**(long **)(str_local + 8) + 0x58))
                (*(long **)(str_local + 8),pCStack_28,count,this->maxLength_);
      str_local[0x30] = '\x06';
      str_local[0x31] = '\0';
      str_local[0x32] = '\0';
      str_local[0x33] = '\0';
      pVVar2 = GetValidateErrorKeyword(kValidateErrorMaxLength);
      pCVar3 = GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               ::GetString(pVVar2);
      *(Ch **)(str_local + 0x28) = pCVar3;
      return false;
    }
  }
  if ((this->pattern_ == (RegexType *)0x0) ||
     (bVar1 = IsPatternMatch(this->pattern_,pCStack_28,count), bVar1)) {
    this_local._7_1_ = CreateParallelValidator(this,(Context *)str_local);
  }
  else {
    (**(code **)(**(long **)(str_local + 8) + 0x68))(*(long **)(str_local + 8),pCStack_28,count);
    str_local[0x30] = '\b';
    str_local[0x31] = '\0';
    str_local[0x32] = '\0';
    str_local[0x33] = '\0';
    pVVar2 = GetValidateErrorKeyword(kValidateErrorPattern);
    pCVar3 = GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             ::GetString(pVVar2);
    *(Ch **)(str_local + 0x28) = pCVar3;
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool String(Context& context, const Ch* str, SizeType length, bool) const {
        RAPIDJSON_SCHEMA_PRINT(Method, "Schema::String", str);
        if (!(type_ & (1 << kStringSchemaType))) {
            DisallowedType(context, GetStringString());
            RAPIDJSON_INVALID_KEYWORD_RETURN(kValidateErrorType);
        }

        if (minLength_ != 0 || maxLength_ != SizeType(~0)) {
            SizeType count;
            if (internal::CountStringCodePoint<EncodingType>(str, length, &count)) {
                if (count < minLength_) {
                    context.error_handler.TooShort(str, length, minLength_);
                    RAPIDJSON_INVALID_KEYWORD_RETURN(kValidateErrorMinLength);
                }
                if (count > maxLength_) {
                    context.error_handler.TooLong(str, length, maxLength_);
                    RAPIDJSON_INVALID_KEYWORD_RETURN(kValidateErrorMaxLength);
                }
            }
        }

        if (pattern_ && !IsPatternMatch(pattern_, str, length)) {
            context.error_handler.DoesNotMatch(str, length);
            RAPIDJSON_INVALID_KEYWORD_RETURN(kValidateErrorPattern);
        }

        return CreateParallelValidator(context);
    }